

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitAtomicRMW(BinaryInstWriter *this,AtomicRMW *curr)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  BasicType BVar4;
  address64_t offset;
  AtomicRMW *curr_local;
  BinaryInstWriter *this_local;
  
  BufferWithRandomAccess::operator<<(this->o,-2);
  switch(curr->op) {
  case RMWAdd:
    BVar4 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar4 == i32) {
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,' ');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'!');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid rmw size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x1e8);
        }
        BufferWithRandomAccess::operator<<(this->o,'\x1e');
      }
    }
    else {
      if (BVar4 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1e8);
      }
      switch(curr->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'\"');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'#');
        break;
      default:
        handle_unreachable("invalid rmw size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1e8);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'$');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'\x1f');
      }
    }
    break;
  case RMWSub:
    BVar4 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar4 == i32) {
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,'\'');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'(');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid rmw size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x1e9);
        }
        BufferWithRandomAccess::operator<<(this->o,'%');
      }
    }
    else {
      if (BVar4 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1e9);
      }
      switch(curr->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,')');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'*');
        break;
      default:
        handle_unreachable("invalid rmw size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1e9);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'+');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'&');
      }
    }
    break;
  case RMWAnd:
    BVar4 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar4 == i32) {
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,'.');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'/');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid rmw size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x1ea);
        }
        BufferWithRandomAccess::operator<<(this->o,',');
      }
    }
    else {
      if (BVar4 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1ea);
      }
      switch(curr->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'0');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'1');
        break;
      default:
        handle_unreachable("invalid rmw size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1ea);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'2');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'-');
      }
    }
    break;
  case RMWOr:
    BVar4 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar4 == i32) {
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,'5');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'6');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid rmw size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x1eb);
        }
        BufferWithRandomAccess::operator<<(this->o,'3');
      }
    }
    else {
      if (BVar4 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1eb);
      }
      switch(curr->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'7');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'8');
        break;
      default:
        handle_unreachable("invalid rmw size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1eb);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'9');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'4');
      }
    }
    break;
  case RMWXor:
    BVar4 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar4 == i32) {
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,'<');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'=');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid rmw size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x1ec);
        }
        BufferWithRandomAccess::operator<<(this->o,':');
      }
    }
    else {
      if (BVar4 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1ec);
      }
      switch(curr->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'>');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'?');
        break;
      default:
        handle_unreachable("invalid rmw size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1ec);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'@');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,';');
      }
    }
    break;
  case RMWXchg:
    BVar4 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type);
    if (BVar4 == i32) {
      uVar1 = curr->bytes;
      if (uVar1 == '\x01') {
        BufferWithRandomAccess::operator<<(this->o,'C');
      }
      else if (uVar1 == '\x02') {
        BufferWithRandomAccess::operator<<(this->o,'D');
      }
      else {
        if (uVar1 != '\x04') {
          handle_unreachable("invalid rmw size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x1ed);
        }
        BufferWithRandomAccess::operator<<(this->o,'A');
      }
    }
    else {
      if (BVar4 != i64) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1ed);
      }
      switch(curr->bytes) {
      case '\x01':
        BufferWithRandomAccess::operator<<(this->o,'E');
        break;
      case '\x02':
        BufferWithRandomAccess::operator<<(this->o,'F');
        break;
      default:
        handle_unreachable("invalid rmw size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1ed);
      case '\x04':
        BufferWithRandomAccess::operator<<(this->o,'G');
        break;
      case '\b':
        BufferWithRandomAccess::operator<<(this->o,'B');
      }
    }
    break;
  default:
    handle_unreachable("unexpected op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1ef);
  }
  bVar2 = curr->bytes;
  bVar3 = curr->bytes;
  offset = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
  emitMemoryAccess(this,(ulong)bVar2,(ulong)bVar3,offset,(Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicRMW(AtomicRMW* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix);

#define CASE_FOR_OP(Op)                                                        \
  case RMW##Op:                                                                \
    switch (curr->type.getBasic()) {                                           \
      case Type::i32:                                                          \
        switch (curr->bytes) {                                                 \
          case 1:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op##8U);                   \
            break;                                                             \
          case 2:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op##16U);                  \
            break;                                                             \
          case 4:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op);                       \
            break;                                                             \
          default:                                                             \
            WASM_UNREACHABLE("invalid rmw size");                              \
        }                                                                      \
        break;                                                                 \
      case Type::i64:                                                          \
        switch (curr->bytes) {                                                 \
          case 1:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##8U);                   \
            break;                                                             \
          case 2:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##16U);                  \
            break;                                                             \
          case 4:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##32U);                  \
            break;                                                             \
          case 8:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op);                       \
            break;                                                             \
          default:                                                             \
            WASM_UNREACHABLE("invalid rmw size");                              \
        }                                                                      \
        break;                                                                 \
      default:                                                                 \
        WASM_UNREACHABLE("unexpected type");                                   \
    }                                                                          \
    break

  switch (curr->op) {
    CASE_FOR_OP(Add);
    CASE_FOR_OP(Sub);
    CASE_FOR_OP(And);
    CASE_FOR_OP(Or);
    CASE_FOR_OP(Xor);
    CASE_FOR_OP(Xchg);
    default:
      WASM_UNREACHABLE("unexpected op");
  }
#undef CASE_FOR_OP

  emitMemoryAccess(curr->bytes, curr->bytes, curr->offset, curr->memory);
}